

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Extract(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_c38;
  LogMessage local_ab8;
  StringPiece local_938;
  RE2 local_928;
  StringPiece local_848;
  LogMessage local_838;
  LogMessage local_6b8;
  StringPiece local_538;
  RE2 local_528;
  StringPiece local_448;
  LogMessage local_438;
  LogMessage local_2b8;
  StringPiece local_138;
  RE2 local_128;
  StringPiece local_38;
  string local_28 [8];
  string s;
  
  std::__cxx11::string::string(local_28);
  StringPiece::StringPiece(&local_38,"boris@kremvax.ru");
  RE2::RE2(&local_128,"(.*)@([^.]*)");
  StringPiece::StringPiece(&local_138,"\\2!\\1");
  bVar1 = RE2::Extract(&local_38,&local_128,&local_138,(string *)local_28);
  RE2::~RE2(&local_128);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xda);
    poVar2 = LogMessage::stream(&local_2b8);
    std::operator<<(poVar2,
                    "Check failed: RE2::Extract(\"boris@kremvax.ru\", \"(.*)@([^.]*)\", \"\\\\2!\\\\1\", &s)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28,"kremvax!boris");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdb);
    poVar2 = LogMessage::stream(&local_438);
    std::operator<<(poVar2,"Check failed: (s) == (\"kremvax!boris\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_438);
  }
  StringPiece::StringPiece(&local_448,"foo");
  RE2::RE2(&local_528,".*");
  StringPiece::StringPiece(&local_538,"\'\\0\'");
  bVar1 = RE2::Extract(&local_448,&local_528,&local_538,(string *)local_28);
  RE2::~RE2(&local_528);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdd);
    poVar2 = LogMessage::stream(&local_6b8);
    std::operator<<(poVar2,"Check failed: RE2::Extract(\"foo\", \".*\", \"\'\\\\0\'\", &s)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6b8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28,"\'foo\'");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_838,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xde);
    poVar2 = LogMessage::stream(&local_838);
    std::operator<<(poVar2,"Check failed: (s) == (\"\'foo\'\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_838);
  }
  StringPiece::StringPiece(&local_848,"baz");
  RE2::RE2(&local_928,"bar");
  StringPiece::StringPiece(&local_938,"\'\\0\'");
  bVar1 = RE2::Extract(&local_848,&local_928,&local_938,(string *)local_28);
  RE2::~RE2(&local_928);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ab8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe0);
    poVar2 = LogMessage::stream(&local_ab8);
    std::operator<<(poVar2,"Check failed: !RE2::Extract(\"baz\", \"bar\", \"\'\\\\0\'\", &s)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ab8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28,"\'foo\'");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c38,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe1);
    poVar2 = LogMessage::stream(&local_c38);
    std::operator<<(poVar2,"Check failed: (s) == (\"\'foo\'\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c38);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(RE2, Extract) {
  VLOG(1) << "TestExtract";

  string s;

  CHECK(RE2::Extract("boris@kremvax.ru", "(.*)@([^.]*)", "\\2!\\1", &s));
  CHECK_EQ(s, "kremvax!boris");

  CHECK(RE2::Extract("foo", ".*", "'\\0'", &s));
  CHECK_EQ(s, "'foo'");
  // check that false match doesn't overwrite
  CHECK(!RE2::Extract("baz", "bar", "'\\0'", &s));
  CHECK_EQ(s, "'foo'");
}